

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzDD::ArchiveOUT(ChNodeFEAxyzDD *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::fea::ChNodeFEAxyzDD>(marchive);
  ChNodeFEAxyzD::ArchiveOUT(&this->super_ChNodeFEAxyzD,marchive);
  local_38._value = (ChVector<double> *)&(this->super_ChNodeFEAxyzD).field_0x140;
  local_38._name = "DD";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->DD_dt;
  local_38._name = "DD_dt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->DD_dtdt;
  local_38._name = "DD_dtdt";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChNodeFEAxyzDD::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAxyzDD>();
    // serialize parent class
    ChNodeFEAxyzD::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(DD);
    marchive << CHNVP(DD_dt);
    marchive << CHNVP(DD_dtdt);
}